

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O3

void init_and_get_number_of_frames(filename_list_node *fln,int *do_scan)

{
  input_ops *piVar1;
  input_handle *piVar2;
  int iVar3;
  undefined8 *puVar4;
  size_t sVar5;
  input_ops *ops;
  input_handle *ih;
  input_ops *local_40;
  input_handle *local_38;
  
  local_40 = (input_ops *)0x0;
  local_38 = (input_handle *)0x0;
  puVar4 = (undefined8 *)g_malloc(0x58);
  fln->d = puVar4;
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  puVar4[9] = 0;
  puVar4[10] = 0;
  iVar3 = open_plugin(fln->fr->raw,fln->fr->display,&local_40,&local_38);
  piVar2 = local_38;
  piVar1 = local_40;
  if (iVar3 == 0) {
    *do_scan = 1;
    sVar5 = (*local_40->get_total_frames)(local_38);
    puVar4[1] = sVar5;
    g_mutex_lock(&progress_mutex);
    total_frames = total_frames + puVar4[1];
    g_cond_broadcast(&progress_cond);
    g_mutex_unlock(&progress_mutex);
    (*piVar1->close_file)(piVar2);
  }
  if (piVar2 != (input_handle *)0x0) {
    (*local_40->handle_destroy)(&local_38);
  }
  return;
}

Assistant:

void
init_and_get_number_of_frames(struct filename_list_node *fln, int *do_scan)
{
	struct file_data *fd;

	struct input_ops *ops = NULL;
	struct input_handle *ih = NULL;
	int result;

	fln->d = g_malloc(sizeof(struct file_data));
	memcpy(fln->d, &empty, sizeof empty);
	fd = (struct file_data *)fln->d;

	result = open_plugin(fln->fr->raw, fln->fr->display, &ops, &ih);
	if (result) {
		goto free;
	}

	*do_scan = TRUE;
	fd->number_of_frames = ops->get_total_frames(ih);
	g_mutex_lock(&progress_mutex);
	total_frames += fd->number_of_frames;
	g_cond_broadcast(&progress_cond);
	g_mutex_unlock(&progress_mutex);

free:
	if (!result) {
		ops->close_file(ih);
	}
	if (ih) {
		ops->handle_destroy(&ih);
	}
}